

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 in_register_0000000c;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  iVar5 = (int)first;
  uVar1 = (ushort)c->width;
  uVar9 = 0;
  iVar6 = 0;
  if ((int)(uint)uVar1 < x0 + iVar5) {
    iVar6 = 0;
    iVar7 = 0;
    uVar9 = 0;
    uVar4 = (uint)uVar1;
    do {
      uVar1 = *(ushort *)((long)&c->width + 2);
      if (uVar9 < uVar1) {
        iVar8 = (uVar1 - uVar9) * iVar7;
        c = *(stbrp_context **)&c->align;
        uVar2 = (ushort)c->width;
        uVar3 = (uint)uVar2;
        uVar9 = (uint)uVar1;
        if ((int)uVar4 < iVar5) {
          iVar10 = (uint)uVar2 - iVar5;
        }
        else {
          iVar10 = uVar2 - uVar4;
        }
      }
      else {
        c = *(stbrp_context **)&c->align;
        uVar3 = (uint)(ushort)c->width;
        iVar10 = x0 - iVar7;
        if ((int)((uVar3 - uVar4) + iVar7) <= x0) {
          iVar10 = uVar3 - uVar4;
        }
        iVar8 = (uVar9 - uVar1) * iVar10;
      }
      iVar6 = iVar6 + iVar8;
      iVar7 = iVar7 + iVar10;
      uVar4 = uVar3;
    } while (uVar3 < (uint)(x0 + iVar5));
  }
  *(int *)CONCAT44(in_register_0000000c,width) = iVar6;
  return uVar9;
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}